

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O2

void aom_highbd_comp_avg_upsampled_pred_c
               (MACROBLOCKD *xd,AV1Common *cm,int mi_row,int mi_col,MV *mv,uint8_t *comp_pred8,
               uint8_t *pred8,int width,int height,int subpel_x_q3,int subpel_y_q3,uint8_t *ref8,
               int ref_stride,int bd,int subpel_search)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  lVar5 = (long)pred8 * 2;
  lVar4 = (long)comp_pred8 * 2;
  aom_highbd_upsampled_pred_sse2
            (xd,cm,mi_row,mi_col,mv,comp_pred8,width,height,subpel_x_q3,subpel_y_q3,ref8,ref_stride,
             bd,subpel_search);
  iVar1 = 0;
  uVar2 = 0;
  if (0 < width) {
    uVar2 = (ulong)(uint)width;
  }
  if (height < 1) {
    height = 0;
  }
  for (; iVar1 != height; iVar1 = iVar1 + 1) {
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      *(short *)(lVar4 + uVar3 * 2) =
           (short)((uint)*(ushort *)(lVar5 + uVar3 * 2) + (uint)*(ushort *)(lVar4 + uVar3 * 2) + 1
                  >> 1);
    }
    lVar4 = lVar4 + (long)width * 2;
    lVar5 = lVar5 + (long)width * 2;
  }
  return;
}

Assistant:

void aom_highbd_comp_avg_upsampled_pred_c(
    MACROBLOCKD *xd, const struct AV1Common *const cm, int mi_row, int mi_col,
    const MV *const mv, uint8_t *comp_pred8, const uint8_t *pred8, int width,
    int height, int subpel_x_q3, int subpel_y_q3, const uint8_t *ref8,
    int ref_stride, int bd, int subpel_search) {
  int i, j;

  const uint16_t *pred = CONVERT_TO_SHORTPTR(pred8);
  uint16_t *comp_pred = CONVERT_TO_SHORTPTR(comp_pred8);
  aom_highbd_upsampled_pred(xd, cm, mi_row, mi_col, mv, comp_pred8, width,
                            height, subpel_x_q3, subpel_y_q3, ref8, ref_stride,
                            bd, subpel_search);
  for (i = 0; i < height; ++i) {
    for (j = 0; j < width; ++j) {
      comp_pred[j] = ROUND_POWER_OF_TWO(pred[j] + comp_pred[j], 1);
    }
    comp_pred += width;
    pred += width;
  }
}